

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_pull_up_Test::TestBody(sim_pull_up_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Var *var;
  unsigned_long *lhs;
  char *message;
  optional<unsigned_long> oVar3;
  AssertHelper local_3a0;
  Message local_398;
  int local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar;
  optional<unsigned_long> v;
  Simulator sim;
  shared_ptr<kratos::Stmt> local_1b0;
  allocator<char> local_199;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_pull_up_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  var = kratos::Generator::var(pGVar2,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pGVar2 = local_138;
  local_178 = var;
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)&sim.simulation_depth_,var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_1b0,(shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Generator::add_stmt(pGVar2,&local_1b0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_1b0);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator
            ((Simulator *)
             &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,local_138);
  oVar3 = kratos::Simulator::get
                    ((Simulator *)
                     &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,local_178);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  lhs = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar.message_);
  local_38c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_388,"*v","1",lhs,&local_38c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xae,message);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  kratos::Simulator::~Simulator
            ((Simulator *)
             &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, pull_up) {    // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 1);
    mod.add_stmt(a.assign(constant(1, 1)));

    Simulator sim(&mod);
    auto v = sim.get(&a);
    EXPECT_EQ(*v, 1);
}